

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Maybe<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_&> __thiscall
kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::
find<capnp::StructSchema&>
          (HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>> *this,
          StructSchema *key)

{
  Maybe<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_&> MVar1;
  anon_class_1_0_00000001 local_29;
  Maybe<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry_&>
  local_28;
  StructSchema *local_20;
  StructSchema *key_local;
  HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_> *this_local;
  
  local_20 = key;
  key_local = (StructSchema *)this;
  local_28 = Table<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>>
             ::find<0ul,capnp::StructSchema&>
                       ((Table<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>>
                         *)this,key);
  MVar1 = Maybe<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry_&>
          ::
          map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp____kj_map_h:358:30)>
                    (&local_28,&local_29);
  return (Maybe<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}